

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained.cpp
# Opt level: O0

non_empty_string * func(non_empty_string *__return_storage_ptr__,non_empty_string *str)

{
  value_type *pvVar1;
  ostream *poVar2;
  value_type *this;
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  local_20;
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  modifier;
  non_empty_string *str_local;
  
  modifier.value_ = str;
  pvVar1 = type_safe::
           constrained_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
           ::get_value(str);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)pvVar1);
  std::operator<<(poVar2,'\n');
  type_safe::
  constrained_type<std::__cxx11::string,type_safe::constraints::non_empty,type_safe::assertion_verifier>
  ::modify<std::__cxx11::string,void>
            ((constrained_type<std::__cxx11::string,type_safe::constraints::non_empty,type_safe::assertion_verifier>
              *)&local_20);
  this = type_safe::
         constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
         ::get(&local_20);
  std::__cxx11::string::operator+=((string *)this," suffix");
  type_safe::
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  ::~constrained_modifier(&local_20);
  type_safe::
  constrained_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  ::constrained_type(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

non_empty_string func(non_empty_string str)
{
    std::cout << str.get_value() << '\n';
    // get_value() returns a const reference
    // if we want to modify it:
    {
        auto modifier = str.modify();
        modifier.get() += " suffix";
        // destructor of modifier verifies that str fulfills constraint again
    } // extra scope is important here
    return str;
}